

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandTempor(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Cex_t *p;
  int iVar1;
  int iVar2;
  int nRegsOld;
  char *pcVar3;
  Abc_Cex_t *local_68;
  Abc_Cex_t *pCexNew;
  uint local_58;
  int c;
  int fVeryVerbose;
  int fVerbose;
  int fUpdateCex;
  int fUseTransSigs;
  int fUseBmc;
  int nConfMax;
  int TimeOut;
  int nFrames;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtkRes;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtkRes = (Abc_Ntk_t *)argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  _TimeOut = Abc_FrameReadNtk(pAbc);
  nConfMax = 0;
  fUseBmc = 300;
  fUseTransSigs = 100000;
  fUpdateCex = 1;
  fVerbose = 0;
  fVeryVerbose = 0;
  c = 0;
  local_58 = 0;
  Extra_UtilGetoptReset();
LAB_00252d82:
  do {
    pCexNew._4_4_ = Extra_UtilGetopt(argv_local._4_4_,(char **)pNtkRes,"FTCbscvwh");
    if (pCexNew._4_4_ == -1) {
      if (_TimeOut == (Abc_Ntk_t *)0x0) {
        Abc_Print(-2,"There is no current network.\n");
        return 0;
      }
      iVar1 = Abc_NtkIsStrash(_TimeOut);
      if (iVar1 == 0) {
        Abc_Print(-2,"The current network is not an AIG (run \"strash\").\n");
        return 0;
      }
      iVar1 = Abc_NtkLatchNum(_TimeOut);
      if (iVar1 == 0) {
        Abc_Print(0,"The current network is combinational.\n");
        return 0;
      }
      iVar1 = Abc_NtkPiNum(_TimeOut);
      if (iVar1 == 0) {
        Abc_Print(0,"The current network does not have primary inputs. Use \"addpi\".\n");
        return 0;
      }
      if (fVeryVerbose == 0) {
        pNtk = Abc_NtkDarTempor(_TimeOut,nConfMax,fUseBmc,fUseTransSigs,fUpdateCex,fVerbose,c,
                                local_58);
        if (pNtk == (Abc_Ntk_t *)0x0) {
          Abc_Print(-1,"Temporal decomposition has failed.\n");
          return 1;
        }
        Abc_FrameReplaceCurrentNetwork(pAStack_18,pNtk);
        return 0;
      }
      if (pAStack_18->pCex == (Abc_Cex_t *)0x0) {
        Abc_Print(-1,"Counter-example is not available.\n");
        return 1;
      }
      iVar1 = pAStack_18->pCex->nPis;
      iVar2 = Abc_NtkPiNum(_TimeOut);
      if (iVar1 % iVar2 != 0) {
        Abc_Print(-1,"PI count of the CEX is not a multiple of PI count of the current AIG.\n");
        return 1;
      }
      p = pAStack_18->pCex;
      iVar1 = Abc_NtkPiNum(_TimeOut);
      iVar2 = Abc_NtkPoNum(_TimeOut);
      nRegsOld = Abc_NtkLatchNum(_TimeOut);
      local_68 = Abc_CexTransformTempor(p,iVar1,iVar2,nRegsOld);
      Abc_FrameReplaceCex(pAStack_18,&local_68);
      return 0;
    }
    switch(pCexNew._4_4_) {
    case 0x43:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_00253127;
      }
      fUseTransSigs = atoi(*(char **)(pNtkRes->nObjCounts + (long)globalUtilOptind * 2 + -0x18));
      iVar1 = fUseTransSigs;
      break;
    default:
      goto switchD_00252dc8_caseD_44;
    case 0x46:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_00253127;
      }
      nConfMax = atoi(*(char **)(pNtkRes->nObjCounts + (long)globalUtilOptind * 2 + -0x18));
      iVar1 = nConfMax;
      break;
    case 0x54:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_00253127;
      }
      fUseBmc = atoi(*(char **)(pNtkRes->nObjCounts + (long)globalUtilOptind * 2 + -0x18));
      iVar1 = fUseBmc;
      break;
    case 0x62:
      fUpdateCex = fUpdateCex ^ 1;
      goto LAB_00252d82;
    case 99:
      fVeryVerbose = fVeryVerbose ^ 1;
      goto LAB_00252d82;
    case 0x68:
switchD_00252dc8_caseD_44:
      goto LAB_00253127;
    case 0x73:
      fVerbose = fVerbose ^ 1;
      goto LAB_00252d82;
    case 0x76:
      c = c ^ 1;
      goto LAB_00252d82;
    case 0x77:
      local_58 = local_58 ^ 1;
      goto LAB_00252d82;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_00253127:
      Abc_Print(-2,"usage: tempor [-FTC <num>] [-bscvwh]\n");
      Abc_Print(-2,"\t           performs temporal decomposition\n");
      Abc_Print(-2,
                "\t-F <num> : init logic timeframe count (0 = use leading length) [default = %d]\n",
                (ulong)(uint)nConfMax);
      Abc_Print(-2,"\t-T <num> : runtime limit in seconds for BMC (0=unused) [default = %d]\n",
                (ulong)(uint)fUseBmc);
      Abc_Print(-2,"\t-C <num> : max number of SAT conflicts in BMC (0=unused) [default = %d]\n",
                (ulong)(uint)fUseTransSigs);
      pcVar3 = "no";
      if (fUpdateCex != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-b       : toggle running BMC2 on the init frames [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (fVerbose != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-s       : toggle using transient signals [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-c       : update the current CEX derived for a new AIG after \"tempor\"\n");
      pcVar3 = "no";
      if (fVeryVerbose != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,
                "\t           to match the current AIG (the one before \"tempor\") [default = %s]\n"
                ,pcVar3);
      pcVar3 = "no";
      if (c != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v       : toggle printing verbose output [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (local_58 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-w       : toggle printing ternary state space [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h       : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandTempor( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Ntk_t * Abc_NtkDarTempor( Abc_Ntk_t * pNtk, int nFrames, int TimeOut, int nConfLimit, int fUseBmc, int fUseTransSigs, int fVerbose, int fVeryVerbose );
    Abc_Ntk_t * pNtkRes, * pNtk = Abc_FrameReadNtk(pAbc);
    int nFrames       =       0;
    int TimeOut       =     300;
    int nConfMax      =  100000;
    int fUseBmc       =       1;
    int fUseTransSigs =       0;
    int fUpdateCex    =       0;
    int fVerbose      =       0;
    int fVeryVerbose  =       0;
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FTCbscvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            TimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( TimeOut < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfMax < 0 )
                goto usage;
            break;
        case 'b':
            fUseBmc ^= 1;
            break;
        case 's':
            fUseTransSigs ^= 1;
            break;
        case 'c':
            fUpdateCex ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -2, "There is no current network.\n");
        return 0;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -2, "The current network is not an AIG (run \"strash\").\n");
        return 0;
    }
    if ( Abc_NtkLatchNum(pNtk) == 0 )
    {
        Abc_Print( 0, "The current network is combinational.\n");
        return 0;
    }
    if ( Abc_NtkPiNum(pNtk) == 0 )
    {
        Abc_Print( 0, "The current network does not have primary inputs. Use \"addpi\".\n");
        return 0;
    }
    if ( fUpdateCex )
    {
        Abc_Cex_t * pCexNew;
        if ( pAbc->pCex == NULL )
        {
            Abc_Print( -1, "Counter-example is not available.\n" );
            return 1;
        }
        if ( pAbc->pCex->nPis % Abc_NtkPiNum(pNtk) != 0 )
        {
            Abc_Print( -1, "PI count of the CEX is not a multiple of PI count of the current AIG.\n" );
            return 1;
        }
        pCexNew = Abc_CexTransformTempor( pAbc->pCex, Abc_NtkPiNum(pNtk), Abc_NtkPoNum(pNtk), Abc_NtkLatchNum(pNtk) );
        Abc_FrameReplaceCex( pAbc, &pCexNew );
        return 0;
    }
    // modify the current network
    pNtkRes = Abc_NtkDarTempor( pNtk, nFrames, TimeOut, nConfMax, fUseBmc, fUseTransSigs, fVerbose, fVeryVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Temporal decomposition has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: tempor [-FTC <num>] [-bscvwh]\n" );
    Abc_Print( -2, "\t           performs temporal decomposition\n" );
    Abc_Print( -2, "\t-F <num> : init logic timeframe count (0 = use leading length) [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-T <num> : runtime limit in seconds for BMC (0=unused) [default = %d]\n", TimeOut );
    Abc_Print( -2, "\t-C <num> : max number of SAT conflicts in BMC (0=unused) [default = %d]\n", nConfMax );
    Abc_Print( -2, "\t-b       : toggle running BMC2 on the init frames [default = %s]\n", fUseBmc? "yes": "no" );
    Abc_Print( -2, "\t-s       : toggle using transient signals [default = %s]\n", fUseTransSigs? "yes": "no" );
    Abc_Print( -2, "\t-c       : update the current CEX derived for a new AIG after \"tempor\"\n" );
    Abc_Print( -2, "\t           to match the current AIG (the one before \"tempor\") [default = %s]\n", fUpdateCex? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle printing verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggle printing ternary state space [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}